

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void int_pow(IntVar *x,IntVar *y,IntVar *z)

{
  IntView<0> _y;
  IntView<0> _x;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  IntVar *in_RDX;
  IntVar *in_RSI;
  IntVar *in_RDI;
  int in_stack_00000088;
  IntRelType in_stack_0000008c;
  IntVar *in_stack_00000090;
  char *local_78;
  PowerPos<0,_0,_0> *in_stack_ffffffffffffff90;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffff98;
  IntVar *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  IntView<0> in_stack_ffffffffffffffc0;
  IntView<0> local_28;
  IntVar *local_18;
  IntVar *local_10;
  IntVar *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = IntVar::getMin((IntVar *)0x26b0f6);
  if (-1 < iVar1) {
    iVar1 = IntVar::getMin((IntVar *)0x26b10c);
    if (0 < iVar1) {
      iVar1 = 0;
      int_rel(in_stack_00000090,in_stack_0000008c,in_stack_00000088);
      pvVar2 = operator_new(0x48);
      IntView<0>::IntView(&local_28,local_8,1,iVar1);
      IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffb8,local_10,1,0);
      IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffffa8,local_18,1,0);
      _x.a = (int)in_stack_ffffffffffffffb0;
      _x.b = SUB84(in_stack_ffffffffffffffb0,4);
      _x.var = in_stack_ffffffffffffffa8;
      _y.var._4_4_ = iVar1;
      _y.var._0_4_ = in_stack_ffffffffffffff98;
      _y._8_8_ = pvVar2;
      PowerPos<0,_0,_0>::PowerPos(in_stack_ffffffffffffff90,_x,_y,in_stack_ffffffffffffffc0);
      return;
    }
  }
  __stream = _stderr;
  pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                   ,0x2f);
  if (pcVar3 == (char *)0x0) {
    local_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
    ;
  }
  else {
    local_78 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/arithmetic.cpp"
                       ,0x2f);
    local_78 = local_78 + 1;
  }
  fprintf(__stream,"%s:%d: ",local_78,0xfc);
  fprintf(_stderr,
          "The constraint int_pow is not yet supported for non-negative base and exponent integer!")
  ;
  abort();
}

Assistant:

void int_pow(IntVar* x, IntVar* y, IntVar* z) {
	// Since we are dealing with integer the exponent 'y' must be at least -1
	// int_rel(y, IRT_GE, -1);
	if (0 <= x->getMin() && 0 < y->getMin()) {
		int_rel(z, IRT_GE, 0);
		new PowerPos<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else {
		CHUFFED_ERROR(
				"The constraint int_pow is not yet supported for non-negative base and exponent integer!");
	}
}